

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::ContextShaderProgram::shadeVertices
          (ContextShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int numComponents;
  GenericVecType GVar1;
  VertexPacket *pVVar2;
  UniformSlot *pUVar3;
  pointer pGVar4;
  long lVar5;
  VertexAttrib *vertexAttrib;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vec2 local_b0;
  Vec3 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  Vec4 local_88;
  VertexAttrib *local_78;
  ulong local_70;
  VertexPacket **local_68;
  ulong local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  local_78 = inputs;
  local_68 = packets;
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_coordScale");
  local_98 = *(undefined8 *)&pUVar3->value;
  uStack_90 = *(undefined8 *)((long)&pUVar3->value + 8);
  pUVar3 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_colorScale");
  if (0 < numPackets) {
    local_58 = (pUVar3->value).f;
    local_70 = (ulong)(uint)numPackets;
    local_98 = CONCAT44((float)local_98,(float)local_98);
    uStack_90 = CONCAT44((float)local_98,(float)local_98);
    local_48 = ZEXT416((uint)local_58);
    local_60 = 0;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    do {
      fVar7 = 1.0;
      fVar6 = 1.0;
      pVVar2 = local_68[local_60];
      local_b0.m_data[0] = 1.0;
      local_b0.m_data[1] = 1.0;
      local_a8.m_data[0] = 1.0;
      local_a8.m_data[1] = 1.0;
      local_a8.m_data[2] = 1.0;
      pGVar4 = (this->m_attrType).
               super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar8 = fVar6;
      fVar9 = fVar7;
      if (0 < (int)((ulong)((long)(this->m_attrType).
                                  super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar4) >> 2))
      {
        lVar5 = 0;
        vertexAttrib = local_78;
        do {
          numComponents =
               (this->m_componentCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5];
          GVar1 = pGVar4[lVar5];
          if (GVar1 == GENERICVECTYPE_INT32) {
            local_88.m_data[0] = 0.0;
            local_88.m_data[1] = 0.0;
            local_88.m_data[2] = 0.0;
            local_88.m_data[3] = 0.0;
            rr::readVertexAttrib
                      ((IVec4 *)&local_88,vertexAttrib,pVVar2->instanceNdx,pVVar2->vertexNdx);
            calcShaderColorCoord<int>
                      (&local_b0,&local_a8,(Vector<int,_4> *)&local_88,lVar5 == 0,numComponents);
          }
          else if (GVar1 == GENERICVECTYPE_UINT32) {
            local_88.m_data[0] = 0.0;
            local_88.m_data[1] = 0.0;
            local_88.m_data[2] = 0.0;
            local_88.m_data[3] = 0.0;
            rr::readVertexAttrib
                      ((UVec4 *)&local_88,vertexAttrib,pVVar2->instanceNdx,pVVar2->vertexNdx);
            calcShaderColorCoord<unsigned_int>
                      (&local_b0,&local_a8,(Vector<unsigned_int,_4> *)&local_88,lVar5 == 0,
                       numComponents);
          }
          else if (GVar1 == GENERICVECTYPE_FLOAT) {
            local_88.m_data[0] = 0.0;
            local_88.m_data[1] = 0.0;
            local_88.m_data[2] = 0.0;
            local_88.m_data[3] = 0.0;
            rr::readVertexAttrib(&local_88,vertexAttrib,pVVar2->instanceNdx,pVVar2->vertexNdx);
            calcShaderColorCoord<float>(&local_b0,&local_a8,&local_88,lVar5 == 0,numComponents);
          }
          lVar5 = lVar5 + 1;
          pGVar4 = (this->m_attrType).
                   super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          vertexAttrib = vertexAttrib + 1;
        } while (lVar5 < (int)((ulong)((long)(this->m_attrType).
                                             super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pGVar4) >> 2));
        fVar8 = local_b0.m_data[0];
        fVar9 = local_b0.m_data[1];
        fVar6 = local_a8.m_data[0];
        fVar7 = local_a8.m_data[1];
      }
      (pVVar2->position).m_data[0] = fVar8 * (float)local_98;
      (pVVar2->position).m_data[1] = fVar9 * local_98._4_4_;
      (pVVar2->position).m_data[2] = 1.0;
      (pVVar2->position).m_data[3] = 1.0;
      *(ulong *)&pVVar2->outputs[0].v = CONCAT44(fVar7 * fStack_54,fVar6 * local_58);
      pVVar2->outputs[0].v.fData[2] = local_a8.m_data[2] * (float)local_48._0_4_;
      pVVar2->outputs[0].v.uData[3] = 0x3f800000;
      local_60 = local_60 + 1;
    } while (local_60 != local_70);
  }
  return;
}

Assistant:

void ContextShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	const float	u_coordScale = getUniformByName("u_coordScale").value.f;
	const float u_colorScale = getUniformByName("u_colorScale").value.f;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const size_t varyingLocColor = 0;

		rr::VertexPacket& packet = *packets[packetNdx];

		// Calc output color
		tcu::Vec2 coord = tcu::Vec2(1.0, 1.0);
		tcu::Vec3 color = tcu::Vec3(1.0, 1.0, 1.0);

		for (int attribNdx = 0; attribNdx < (int)m_attrType.size(); attribNdx++)
		{
			const int numComponents = m_componentCount[attribNdx];

			switch (m_attrType[attribNdx])
			{
				case rr::GENERICVECTYPE_FLOAT:	calcShaderColorCoord(coord, color, rr::readVertexAttribFloat(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), attribNdx == 0, numComponents);	break;
				case rr::GENERICVECTYPE_INT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribInt	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), attribNdx == 0, numComponents);	break;
				case rr::GENERICVECTYPE_UINT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribUint	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), attribNdx == 0, numComponents);	break;
				default:
					DE_ASSERT(false);
			}
		}

		// Transform position
		{
			packet.position = tcu::Vec4(u_coordScale * coord.x(), u_coordScale * coord.y(), 1.0f, 1.0f);
		}

		// Pass color to FS
		{
			packet.outputs[varyingLocColor] = tcu::Vec4(u_colorScale * color.x(), u_colorScale * color.y(), u_colorScale * color.z(), 1.0f);
		}
	}
}